

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

bool __thiscall
free_format_parser::HMpsFF::getMpsLine(HMpsFF *this,istream *file,string *strline,bool *skip)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  istream *piVar4;
  
  *skip = false;
  piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(file,(string *)strline);
  uVar1 = *(uint *)(&piVar4->field_0x20 + (long)piVar4->_vptr_basic_istream[-3]);
  if ((uVar1 & 5) == 0) {
    bVar2 = is_empty(strline,&default_non_chars_abi_cxx11_);
    bVar3 = true;
    if ((!bVar2) && (*(strline->_M_dataplus)._M_p != '*')) {
      trim(strline,&default_non_chars_abi_cxx11_);
      std::__cxx11::string::_M_assign((string *)strline);
      bVar3 = is_empty(strline,&default_non_chars_abi_cxx11_);
    }
    *skip = bVar3;
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool HMpsFF::getMpsLine(std::istream& file, std::string& strline, bool& skip) {
  const bool remove_trailing_comments = false;
  skip = false;
  if (!getline(file, strline)) return false;
  if (is_empty(strline) || strline[0] == '*') {
    skip = true;
  } else {
    if (remove_trailing_comments) {
      // Remove any trailing comment
      const size_t p = strline.find_first_of(mps_comment_chars);
      if (p <= strline.length()) {
        // A comment character has been found, so erase from it to the end
        // of the line and check whether the line is now empty
        strline.erase(p);
        skip = is_empty(strline);
        if (skip) return true;
      }
    }
    strline = trim(strline);
    skip = is_empty(strline);
  }
  return true;
}